

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityCosseratMesh::ComputeStress
          (ChElasticityCosseratMesh *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  undefined8 *puVar24;
  pointer pCVar25;
  pointer pCVar26;
  long lVar27;
  ulong uVar28;
  undefined8 *puVar29;
  uint uVar30;
  size_type __n;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial> mmat;
  vector<double,_std::allocator<double>_> sigma_xy;
  vector<double,_std::allocator<double>_> sigma_xx;
  vector<double,_std::allocator<double>_> gamma_xz;
  vector<double,_std::allocator<double>_> gamma_xy;
  vector<double,_std::allocator<double>_> sigma_xz;
  vector<double,_std::allocator<double>_> epsilon_xx;
  double *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  long local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  ChVector<double> *local_70;
  ChVector<double> *local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_d8 = (long)(this->triangles).
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->triangles).
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar30 = (uint)((ulong)((long)(this->vertexes).
                                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vertexes).
                               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  __n = (size_type)(int)uVar30;
  local_68 = stress_n;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,(allocator_type *)&local_88);
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__n,(allocator_type *)&local_a0);
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,__n,(allocator_type *)&local_b8);
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__n,(allocator_type *)&local_d0);
  local_70 = stress_m;
  std::vector<double,_std::allocator<double>_>::vector(&local_d0,__n,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__n,(allocator_type *)&local_e8);
  local_d8 = local_d8 >> 2;
  if (0 < (int)uVar30) {
    uVar28 = (ulong)(uVar30 & 0x7fffffff);
    lVar27 = 0;
    lVar31 = 0;
    do {
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      puVar24 = *(undefined8 **)&this->materials;
      puVar29 = (undefined8 *)((long)puVar24 + lVar31);
      if (*(long *)&this->field_0x30 - (long)puVar24 == 0x10) {
        puVar29 = puVar24;
      }
      local_e8 = (double *)*puVar29;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_e0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar29 + 1));
      pCVar25 = (this->vertexes).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar1 = *(double *)((long)pCVar25->m_data + lVar27 * 2);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar1;
      dVar2 = *(double *)((long)pCVar25->m_data + lVar27 * 2 + 8);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar2;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = strain_m->m_data[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = strain_n->m_data[0];
      auVar42 = vfmadd213sd_fma(auVar39,auVar36,auVar42);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = strain_m->m_data[2];
      auVar42 = vfnmadd231sd_fma(auVar42,auVar34,auVar43);
      *(long *)((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar27) = auVar42._0_8_;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = strain_m->m_data[0];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = strain_n->m_data[1];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = 0.0 - dVar2;
      auVar42 = vfmadd213sd_fma(auVar37,auVar40,auVar32);
      *(long *)((long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar27) = auVar42._0_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = strain_m->m_data[0];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = strain_n->m_data[2];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar1 + 0.0;
      auVar42 = vfmadd213sd_fma(auVar35,auVar38,auVar33);
      *(long *)((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar27) = auVar42._0_8_;
      *(double *)
       ((long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27) =
           *local_e8 *
           *(double *)
            ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27);
      *(double *)
       ((long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27) =
           local_e8[1] *
           *(double *)
            ((long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27);
      *(double *)
       ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar27) =
           local_e8[1] *
           *(double *)
            ((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar27);
      if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
      }
      lVar31 = lVar31 + 0x10;
      lVar27 = lVar27 + 8;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  uVar30 = (int)local_d8 * -0x55555555;
  if (local_68 != (ChVector<double> *)&VNULL) {
    local_68->m_data[0] = VNULL;
    local_68->m_data[1] = DAT_00b90ac0;
    local_68->m_data[2] = DAT_00b90ac8;
  }
  if (local_70 != (ChVector<double> *)&VNULL) {
    local_70->m_data[0] = VNULL;
    local_70->m_data[1] = DAT_00b90ac0;
    local_70->m_data[2] = DAT_00b90ac8;
  }
  if (0 < (int)uVar30) {
    pCVar25 = (this->vertexes).
              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar26 = (this->triangles).
              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar27 = 0;
    auVar41._8_8_ = 0x7fffffffffffffff;
    auVar41._0_8_ = 0x7fffffffffffffff;
    auVar42 = ZEXT816(0x4028000000000000);
    auVar43 = ZEXT816(0x4038000000000000);
    do {
      iVar21 = *(int *)((long)pCVar26->m_data + lVar27);
      iVar22 = *(int *)((long)pCVar26->m_data + lVar27 + 4);
      iVar23 = *(int *)((long)pCVar26->m_data + lVar27 + 8);
      dVar1 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar21];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar1;
      auVar58._8_8_ = 0;
      auVar58._0_8_ =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar21];
      dVar2 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar21];
      dVar3 = pCVar25[iVar21].m_data[0];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar3;
      dVar4 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar22];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar4;
      dVar5 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar22];
      dVar6 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar22];
      dVar7 = pCVar25[iVar21].m_data[1];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar7;
      dVar8 = pCVar25[iVar22].m_data[0];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar8;
      dVar9 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar23];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar9;
      dVar10 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar23];
      dVar11 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar23];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar11;
      dVar12 = pCVar25[iVar22].m_data[1];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = dVar12;
      dVar13 = pCVar25[iVar23].m_data[0];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar13;
      dVar14 = pCVar25[iVar23].m_data[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar14;
      auVar32 = vsubsd_avx512f(auVar51,auVar53);
      auVar33 = vsubsd_avx512f(auVar53,auVar55);
      auVar33 = vmulsd_avx512f(auVar49,auVar33);
      auVar32 = vfmadd231sd_avx512f(auVar33,auVar48,auVar32);
      auVar33 = vsubsd_avx512f(auVar55,auVar51);
      auVar32 = vfmadd213sd_avx512f(auVar33,auVar50,auVar32);
      auVar32 = vmulsd_avx512f(auVar32,ZEXT816(0x3fe0000000000000));
      auVar33 = vmulsd_avx512f(auVar48,auVar58);
      auVar32 = vandpd_avx512vl(auVar32,auVar41);
      auVar33 = vdivsd_avx512f(auVar33,auVar42);
      auVar34 = vmulsd_avx512f(auVar49,auVar58);
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar33 = vaddsd_avx512f(auVar33,auVar34);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar5;
      auVar34 = vmulsd_avx512f(auVar48,auVar64);
      auVar35 = vmulsd_avx512f(auVar32,ZEXT816(0x3fd5555555555555));
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar33 = vaddsd_avx512f(auVar33,auVar34);
      auVar34 = vmulsd_avx512f(auVar50,auVar58);
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar36 = vmulsd_avx512f(auVar49,auVar64);
      auVar33 = vaddsd_avx512f(auVar34,auVar33);
      auVar34 = vdivsd_avx512f(auVar36,auVar42);
      auVar33 = vaddsd_avx512f(auVar34,auVar33);
      auVar34 = vaddsd_avx512f(auVar47,auVar44);
      auVar34 = vaddsd_avx512f(auVar34,auVar46);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_68->m_data[0];
      auVar34 = vfmadd213sd_avx512f(auVar34,auVar35,auVar15);
      vmovsd_avx512f(auVar34);
      local_68->m_data[0] = local_68->m_data[0];
      auVar66._8_8_ = 0;
      auVar66._0_8_ = dVar10;
      auVar34 = vmulsd_avx512f(auVar48,auVar66);
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar33 = vaddsd_avx512f(auVar34,auVar33);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar6;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar2;
      auVar34 = vaddsd_avx512f(auVar62,auVar60);
      auVar34 = vaddsd_avx512f(auVar34,auVar59);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_68->m_data[1];
      auVar34 = vfmadd213sd_avx512f(auVar34,auVar35,auVar16);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = dVar5;
      auVar36 = vaddsd_avx512f(auVar58,auVar65);
      auVar36 = vaddsd_avx512f(auVar36,auVar66);
      auVar37 = vaddsd_avx512f(auVar32,auVar32);
      auVar32 = vmulsd_avx512f(auVar50,auVar65);
      auVar32 = vdivsd_avx512f(auVar32,auVar43);
      auVar32 = vaddsd_avx512f(auVar32,auVar33);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar10;
      auVar33 = vmulsd_avx512f(auVar49,auVar67);
      auVar33 = vdivsd_avx512f(auVar33,auVar43);
      auVar32 = vaddsd_avx512f(auVar33,auVar32);
      auVar33 = vmulsd_avx512f(auVar50,auVar67);
      auVar33 = vdivsd_avx512f(auVar33,auVar42);
      vmovsd_avx512f(auVar34);
      local_68->m_data[1] = local_68->m_data[1];
      auVar32 = vaddsd_avx512f(auVar33,auVar32);
      auVar33 = vmulsd_avx512f(auVar55,auVar62);
      auVar33 = vdivsd_avx512f(auVar33,auVar42);
      auVar32 = vsubsd_avx512f(auVar32,auVar33);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar2;
      auVar33 = vmulsd_avx512f(auVar51,auVar63);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_68->m_data[2];
      auVar34 = vfmadd213sd_avx512f(auVar36,auVar35,auVar17);
      auVar33 = vdivsd_avx512f(auVar33,auVar43);
      auVar35 = vmulsd_avx512f(auVar55,auVar60);
      auVar35 = vdivsd_avx512f(auVar35,auVar43);
      auVar36 = vmulsd_avx512f(auVar53,auVar63);
      auVar36 = vdivsd_avx512f(auVar36,auVar43);
      auVar32 = vsubsd_avx512f(auVar32,auVar33);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar6;
      auVar33 = vmulsd_avx512f(auVar51,auVar61);
      auVar33 = vdivsd_avx512f(auVar33,auVar42);
      auVar38 = vmulsd_avx512f(auVar55,auVar59);
      auVar38 = vdivsd_avx512f(auVar38,auVar43);
      auVar39 = vmulsd_avx512f(auVar53,auVar61);
      auVar32 = vsubsd_avx512f(auVar32,auVar35);
      auVar35 = vdivsd_avx512f(auVar39,auVar43);
      auVar39 = vmulsd_avx512f(auVar55,auVar47);
      auVar39 = vdivsd_avx512f(auVar39,auVar42);
      auVar40 = vmulsd_avx512f(auVar51,auVar47);
      auVar40 = vdivsd_avx512f(auVar40,auVar43);
      auVar32 = vsubsd_avx512f(auVar32,auVar36);
      auVar36 = vaddsd_avx512f(auVar39,auVar40);
      auVar39 = vmulsd_avx512f(auVar51,auVar59);
      auVar39 = vdivsd_avx512f(auVar39,auVar43);
      auVar32 = vsubsd_avx512f(auVar32,auVar33);
      auVar33 = vmulsd_avx512f(auVar55,auVar44);
      auVar33 = vdivsd_avx512f(auVar33,auVar43);
      auVar33 = vaddsd_avx512f(auVar36,auVar33);
      auVar36 = vmulsd_avx512f(auVar53,auVar47);
      auVar36 = vdivsd_avx512f(auVar36,auVar43);
      vmovsd_avx512f(auVar34);
      local_68->m_data[2] = local_68->m_data[2];
      auVar33 = vaddsd_avx512f(auVar36,auVar33);
      auVar34 = vmulsd_avx512f(auVar51,auVar44);
      auVar34 = vdivsd_avx512f(auVar34,auVar42);
      auVar33 = vaddsd_avx512f(auVar34,auVar33);
      auVar32 = vsubsd_avx512f(auVar32,auVar38);
      auVar56._0_8_ = (dVar7 * dVar9) / 24.0;
      auVar56._8_8_ = 0;
      auVar33 = vaddsd_avx512f(auVar56,auVar33);
      auVar34 = vmulsd_avx512f(auVar53,auVar44);
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar33 = vaddsd_avx512f(auVar34,auVar33);
      auVar32 = vsubsd_avx512f(auVar32,auVar35);
      auVar32 = vsubsd_avx512f(auVar32,auVar39);
      auVar54._0_8_ = (dVar3 * dVar1) / 12.0;
      auVar54._8_8_ = 0;
      auVar34 = vmulsd_avx512f(auVar49,auVar47);
      auVar34 = vdivsd_avx512f(auVar34,auVar43);
      auVar34 = vaddsd_avx512f(auVar54,auVar34);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_70->m_data[0];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auVar32._0_8_ - (dVar14 * dVar11) / 12.0;
      auVar32 = vfmadd213sd_fma(auVar57,auVar37,auVar18);
      local_70->m_data[0] = auVar32._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_70->m_data[1];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = (dVar14 * dVar9) / 12.0 + (dVar12 * dVar9) / 24.0 + auVar33._0_8_;
      auVar32 = vfmadd213sd_fma(auVar52,auVar37,auVar19);
      local_70->m_data[1] = auVar32._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_70->m_data[2];
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           (dVar13 * dVar9) / 12.0 +
           (dVar8 * dVar9) / 24.0 +
           (dVar13 * dVar4) / 24.0 +
           (dVar3 * dVar9) / 24.0 +
           (dVar8 * dVar4) / 12.0 + auVar34._0_8_ + (dVar3 * dVar4) / 24.0 + (dVar13 * dVar1) / 24.0
      ;
      auVar32 = vfnmadd213sd_fma(auVar45,auVar37,auVar20);
      local_70->m_data[2] = auVar32._0_8_;
      lVar27 = lVar27 + 0xc;
    } while ((ulong)(uVar30 & 0x7fffffff) * 0xc != lVar27);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChElasticityCosseratMesh::ComputeStress(ChVector<>& stress_n,
                                             ChVector<>& stress_m,
                                             const ChVector<>& strain_n,
                                             const ChVector<>& strain_m) {
    int nv = (int)this->vertexes.size();
    int nt = (int)this->triangles.size();

    // temp per-vertex data for point strains:
    std::vector<double> epsilon_xx(nv);
    std::vector<double> gamma_xy(nv);
    std::vector<double> gamma_xz(nv);

    // temp per-vertex data for point stresses:
    std::vector<double> sigma_xx(nv);
    std::vector<double> sigma_xy(nv);
    std::vector<double> sigma_xz(nv);

    double warp_dy = 0;  // to do
    double warp_dz = 0;  // to do

    for (int i = 0; i < nv; ++i) {
        std::shared_ptr<ChSectionMaterial> mmat;
        if (materials.size() == 1)
            mmat = materials[0];
        else
            mmat = materials[i];

        double vy = vertexes[i][0];
        double vz = vertexes[i][1];
        epsilon_xx[i] = strain_n.x() + strain_m.y() * vz - strain_m.z() * vy;
        gamma_xy[i] = strain_n.y() + strain_m.x() * (warp_dy - vz);
        gamma_xz[i] = strain_n.z() + strain_m.x() * (warp_dz + vy);
        // simple linear elastic model:
        sigma_xx[i] = mmat->E * epsilon_xx[i];
        sigma_xy[i] = mmat->G * gamma_xy[i];
        sigma_xz[i] = mmat->G * gamma_xz[i];
    }

    // integrate on triangles, assuming linear interpolation of vertex values
    stress_n = VNULL;
    stress_m = VNULL;
    for (int t = 0; t < nt; ++t) {
        size_t iv1 = triangles[t].x();
        size_t iv2 = triangles[t].y();
        size_t iv3 = triangles[t].z();
        double y1 = this->vertexes[iv1][0];
        double z1 = this->vertexes[iv1][1];
        double y2 = this->vertexes[iv2][0];
        double z2 = this->vertexes[iv2][1];
        double y3 = this->vertexes[iv3][0];
        double z3 = this->vertexes[iv3][1];

        double A = fabs(0.5 * ((y1 * (z2 - z3) + y2 * (z3 - z1) + y3 * (z1 - z2))));

        double s1 = sigma_xx[iv1];
        double s2 = sigma_xx[iv2];
        double s3 = sigma_xx[iv3];
        double sxz1 = sigma_xz[iv1];
        double sxz2 = sigma_xz[iv2];
        double sxz3 = sigma_xz[iv3];
        double sxy1 = sigma_xy[iv1];
        double sxy2 = sigma_xy[iv2];
        double sxy3 = sigma_xy[iv3];

        stress_n.x() += (1. / 3.) * A * (s1 + s2 + s3);
        stress_n.y() += (1. / 3.) * A * (sxy1 + sxy2 + sxy3);
        stress_n.z() += (1. / 3.) * A * (sxz1 + sxz2 + sxz3);

        stress_m.x() +=
            2. * A *
            ((sxz1 * y1) / 12. + (sxz1 * y2) / 24. + (sxz2 * y1) / 24. + (sxz1 * y3) / 24. + (sxz2 * y2) / 12. +
             (sxz3 * y1) / 24. + (sxz2 * y3) / 24. + (sxz3 * y2) / 24. + (sxz3 * y3) / 12. - (sxy1 * z1) / 12. -
             (sxy1 * z2) / 24. - (sxy2 * z1) / 24. - (sxy1 * z3) / 24. - (sxy2 * z2) / 12. - (sxy3 * z1) / 24. -
             (sxy2 * z3) / 24. - (sxy3 * z2) / 24. - (sxy3 * z3) / 12.);
        stress_m.y() += 2. * A *
                        ((s1 * z1) / 12. + (s1 * z2) / 24. + (s2 * z1) / 24. + (s1 * z3) / 24. + (s2 * z2) / 12. +
                         (s3 * z1) / 24. + (s2 * z3) / 24. + (s3 * z2) / 24. + (s3 * z3) / 12.);
        stress_m.z() -= 2. * A *
                        ((s1 * y1) / 12. + (s1 * y2) / 24. + (s2 * y1) / 24. + (s1 * y3) / 24. + (s2 * y2) / 12. +
                         (s3 * y1) / 24. + (s2 * y3) / 24. + (s3 * y2) / 24. + (s3 * y3) / 12.);
    }
}